

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O1

int sign(EVP_PKEY_CTX *ctx,uchar *sig,size_t *siglen,uchar *tbs,size_t tbslen)

{
  pointer *ppuVar1;
  vector<asn1::DER,_std::allocator<asn1::DER>_> *pvVar2;
  char cVar3;
  undefined8 uVar4;
  bool bVar5;
  uint32_t uVar6;
  long *plVar7;
  undefined8 *puVar8;
  void *pvVar9;
  BIO *bp;
  RSA *rsa;
  uchar *sigret;
  size_type *extraout_RAX;
  size_type *psVar10;
  uint uVar11;
  long *plVar12;
  allocator_type *__a;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar13;
  long lVar14;
  ptrdiff_t _Num;
  ulong __n;
  pointer pDVar15;
  uint uVar16;
  size_t sVar17;
  undefined8 uVar18;
  value_type_conflict1 *__val;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar19;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v_4;
  uchar local_5a8 [8];
  uchar sha [20];
  undefined1 local_588 [8];
  SHA_CTX context;
  uint8_t manifestSha [20];
  uchar local_504 [36];
  uchar digest [20];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4c8;
  vec8 local_4b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_498;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_480;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_468;
  vec8 local_450;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_438;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_420;
  vec8 local_408;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3c0;
  vec8 local_3a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_390;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_378;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_360;
  vec8 local_348;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_330;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_318;
  vec8 local_300;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2e8;
  vec8 local_2d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_288;
  vec8 local_270;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_258;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_240;
  undefined1 local_228 [8];
  string head;
  vector<char,_std::allocator<char>_> digestCopy;
  string manifestMF;
  size_type *local_1c8;
  string sigHead;
  undefined1 auStack_188 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> certMetaData;
  undefined1 local_168 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  uint signLen;
  undefined1 local_138 [8];
  DER certData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sign;
  string pemKey;
  vector<unsigned_char,_std::allocator<unsigned_char>_> certificate;
  size_type *local_80;
  string certSF;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  vector<asn1::DER,_std::allocator<asn1::DER>_> *local_40;
  allocator_type local_35;
  allocator_type local_34;
  allocator_type local_33;
  allocator_type local_32;
  allocator_type local_31;
  
  local_228 = (undefined1  [8])&head._M_string_length;
  manifestMF.field_2._8_8_ = sig;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_228,"Manifest-Version: 1.0\r\nCreated-By: 1.0 (Fastzip)\r\n\r\n","");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &digestCopy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)siglen);
  SHA1_Init((SHA_CTX *)local_588);
  SHA1_Update((SHA_CTX *)local_588,
              digestCopy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(size_t)manifestMF._M_dataplus._M_p);
  SHA1_Final((uchar *)(context.data + 0xf),(SHA_CTX *)local_588);
  uVar6 = crc32_fast(digestCopy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,(size_t)manifestMF._M_dataplus._M_p,0
                    );
  local_138 = (undefined1  [8])&certData.children;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"META-INF/MANIFEST.MF","");
  ZipArchive::addFile((ZipArchive *)ctx,(string *)local_138,true,
                      (uint64_t)manifestMF._M_dataplus._M_p,(uint64_t)manifestMF._M_dataplus._M_p,0,
                      uVar6,0);
  if (local_138 != (undefined1  [8])&certData.children) {
    operator_delete((void *)local_138,
                    (ulong)&(certData.children.
                             super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
                             super__Vector_impl_data._M_start)->field_0x1);
  }
  fwrite(digestCopy.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage,1,(size_t)manifestMF._M_dataplus._M_p,*(FILE **)(ctx + 0x28));
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)((long)&head.field_2 + 8),siglen[1] + 1,
             (allocator_type *)local_138);
  strcpy((char *)head.field_2._8_8_,(char *)*siglen);
  uVar18 = head.field_2._8_8_;
LAB_0012462a:
  pvVar9 = (void *)(uVar18 + 4);
  sVar17 = 4;
  do {
    if (*(char *)((long)pvVar9 + -4) == '\r') {
      if (((*(char *)((long)pvVar9 + -3) == '\n') && (*(char *)((long)pvVar9 + -2) == '\r')) &&
         (*(char *)((long)pvVar9 + -1) == '\n')) {
        SHA1_Init((SHA_CTX *)local_588);
        SHA1_Update((SHA_CTX *)local_588,(void *)uVar18,sVar17);
        SHA1_Final(local_5a8,(SHA_CTX *)local_588);
        base64_encode_abi_cxx11_((string *)local_138,local_5a8,0x14);
        uVar18 = *(undefined8 *)local_138;
        pDVar15 = *(pointer *)((long)local_138 + 8);
        uVar4 = *(undefined8 *)((long)local_138 + 0x14);
        *(undefined8 *)((long)pvVar9 + -0x14) = *(undefined8 *)((long)local_138 + 0xc);
        *(undefined8 *)((long)pvVar9 + -0xc) = uVar4;
        *(undefined8 *)((long)pvVar9 + -0x20) = uVar18;
        *(pointer *)((long)pvVar9 + -0x18) = pDVar15;
        if (local_138 != (undefined1  [8])&certData.children) {
          operator_delete((void *)local_138,
                          (ulong)&(certData.children.
                                   super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl
                                   .super__Vector_impl_data._M_start)->field_0x1);
        }
        bVar5 = true;
        uVar18 = pvVar9;
        goto LAB_001246e0;
      }
    }
    else if (*(char *)((long)pvVar9 + -4) == '\0') break;
    pvVar9 = (void *)((long)pvVar9 + 1);
    sVar17 = sVar17 + 1;
  } while( true );
  bVar5 = false;
LAB_001246e0:
  if (!bVar5) goto code_r0x001246eb;
  goto LAB_0012462a;
code_r0x001246eb:
  local_1c8 = &sigHead._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c8,
             "Signature-Version: 1.0\r\nCreated-By: 1.0 (Fastzip)\r\nSHA1-Digest-Manifest: ","");
  base64_encode_abi_cxx11_((string *)((long)&certSF.field_2 + 8),(uchar *)(context.data + 0xf),0x14)
  ;
  plVar7 = (long *)std::__cxx11::string::replace
                             ((ulong)((long)&certSF.field_2 + 8),0,(char *)0x0,(ulong)local_1c8);
  sign.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&pemKey._M_string_length;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar10) {
    pemKey._M_string_length = *psVar10;
    pemKey.field_2._M_allocated_capacity = plVar7[3];
  }
  else {
    pemKey._M_string_length = *psVar10;
    sign.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar7;
  }
  pemKey._M_dataplus._M_p = (pointer)plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append
                             ((char *)&sign.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar18 = head.field_2._8_8_;
  plVar12 = plVar7 + 2;
  if ((vector<asn1::DER,_std::allocator<asn1::DER>_> *)*plVar7 ==
      (vector<asn1::DER,_std::allocator<asn1::DER>_> *)plVar12) {
    certData.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*plVar12;
    certData.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)plVar7[3];
    local_138 = (undefined1  [8])&certData.children;
  }
  else {
    certData.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*plVar12;
    local_138 = (undefined1  [8])*plVar7;
  }
  certData._0_8_ = plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  ppuVar1 = &certificate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  pemKey.field_2._8_8_ = ppuVar1;
  if (head.field_2._8_8_ == 0) {
    lVar14 = 1;
  }
  else {
    sVar17 = strlen((char *)head.field_2._8_8_);
    lVar14 = sVar17 + uVar18;
  }
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&pemKey.field_2 + 8),uVar18,lVar14);
  pDVar15 = (pointer)0xf;
  if (local_138 != (undefined1  [8])&certData.children) {
    pDVar15 = certData.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (pDVar15 < (pointer)(certificate.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start + certData._0_8_)) {
    pDVar15 = (pointer)0xf;
    if ((pointer *)pemKey.field_2._8_8_ != ppuVar1) {
      pDVar15 = (pointer)certificate.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    if ((pointer)(certificate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start + certData._0_8_) <= pDVar15) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)((long)&pemKey.field_2 + 8),0,(char *)0x0,(ulong)local_138);
      goto LAB_001248a5;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append(local_138,pemKey.field_2._8_8_);
LAB_001248a5:
  local_80 = &certSF._M_string_length;
  psVar10 = puVar8 + 2;
  if ((size_type *)*puVar8 == psVar10) {
    certSF._M_string_length = *psVar10;
    certSF.field_2._M_allocated_capacity = puVar8[3];
  }
  else {
    certSF._M_string_length = *psVar10;
    local_80 = (size_type *)*puVar8;
  }
  certSF._M_dataplus._M_p = (pointer)puVar8[1];
  *puVar8 = psVar10;
  puVar8[1] = 0;
  *(undefined1 *)psVar10 = 0;
  if ((pointer *)pemKey.field_2._8_8_ != ppuVar1) {
    operator_delete((void *)pemKey.field_2._8_8_,
                    (ulong)(certificate.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish + 1));
  }
  pvVar2 = &certData.children;
  if (local_138 != (undefined1  [8])pvVar2) {
    operator_delete((void *)local_138,
                    (ulong)&(certData.children.
                             super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
                             super__Vector_impl_data._M_start)->field_0x1);
  }
  if ((size_type *)
      sign.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != &pemKey._M_string_length) {
    operator_delete(sign.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,pemKey._M_string_length + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)certSF.field_2._8_8_ != &local_50) {
    operator_delete((void *)certSF.field_2._8_8_,local_50._M_allocated_capacity + 1);
  }
  uVar6 = crc32_fast(local_80,(size_t)certSF._M_dataplus._M_p,0);
  local_138 = (undefined1  [8])pvVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"META-INF/CERT.SF","");
  ZipArchive::addFile((ZipArchive *)ctx,(string *)local_138,true,(uint64_t)certSF._M_dataplus._M_p,
                      (uint64_t)certSF._M_dataplus._M_p,0,uVar6,0);
  if (local_138 != (undefined1  [8])pvVar2) {
    operator_delete((void *)local_138,
                    (ulong)&(certData.children.
                             super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
                             super__Vector_impl_data._M_start)->field_0x1);
  }
  fwrite(local_80,1,(size_t)certSF._M_dataplus._M_p,*(FILE **)(ctx + 0x28));
  local_504[0x1c] = '\0';
  local_504[0x1d] = '\0';
  local_504[0x1e] = '\0';
  local_504[0x1f] = '\0';
  local_504[0x20] = '\0';
  local_504[0x21] = '\0';
  local_504[0x22] = '\0';
  local_504[0x23] = '\0';
  digest[0] = '\0';
  digest[1] = '\0';
  digest[2] = '\0';
  digest[3] = '\0';
  digest[4] = '\0';
  digest[5] = '\0';
  digest[6] = '\0';
  digest[7] = '\0';
  digest[8] = '\0';
  digest[9] = '\0';
  digest[10] = '\0';
  digest[0xb] = '\0';
  SHA1_Init((SHA_CTX *)local_588);
  SHA1_Update((SHA_CTX *)local_588,local_80,(size_t)certSF._M_dataplus._M_p);
  SHA1_Final(local_504 + 0x1c,(SHA_CTX *)local_588);
  KeyStore::getKey((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_138,
                   (KeyStore *)manifestMF.field_2._8_8_,(string *)(manifestMF.field_2._8_8_ + 0x58),
                   (string *)(manifestMF.field_2._8_8_ + 0x38));
  pDVar15 = certData.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar18 = certData._0_8_;
  sigHead.field_2._8_8_ = 0;
  local_40 = (vector<asn1::DER,_std::allocator<asn1::DER>_> *)local_138;
  __n = certData._0_8_ - (long)local_138;
  if (__n == 0) {
    pvVar9 = (void *)0x0;
  }
  else {
    if ((long)__n < 0) {
      std::__throw_bad_alloc();
    }
    pvVar9 = operator_new(__n);
  }
  sigHead.field_2._8_8_ = pvVar9;
  if ((vector<asn1::DER,_std::allocator<asn1::DER>_> *)uVar18 != local_40) {
    memmove(pvVar9,local_40,__n);
  }
  toPem_abi_cxx11_((string *)
                   &sign.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)&sigHead.field_2 + 8));
  if (sigHead.field_2._8_8_ != 0) {
    operator_delete((void *)sigHead.field_2._8_8_,(long)pvVar9 + (__n - sigHead.field_2._8_8_));
  }
  bp = BIO_new_mem_buf(sign.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,-1);
  rsa = PEM_read_bio_RSAPrivateKey(bp,(RSA **)0x0,(undefined1 *)0x0,(void *)0x0);
  if (rsa == (RSA *)0x0) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar8 = &PTR__exception_0014bb08;
    puVar8[1] = "Could not read valid RSA key";
    __cxa_throw(puVar8,&sign_exception::typeinfo,std::exception::~exception);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)&pemKey.field_2 + 8),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             (manifestMF.field_2._8_8_ + 0x20));
  asn1::readDER((DER *)local_138,
                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)((long)&pemKey.field_2 + 8)
               );
  auStack_188 = (undefined1  [8])0x0;
  certMetaData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  certMetaData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (*(undefined1 **)(certData._0_8_ + 8) == *(undefined1 **)(certData._0_8_ + 0x10)) {
    uVar16 = 0;
  }
  else {
    uVar16 = 0;
    pvVar13 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
              (*(undefined1 **)(certData._0_8_ + 8) + 0x20);
    do {
      uVar11 = uVar16;
      if (uVar16 == 0) {
        uVar11 = *(uint *)&pvVar13[2].
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish;
      }
      cVar3 = *(char *)&pvVar13[-2].
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
      if (cVar3 == '\x02') {
        uVar16 = uVar11;
      }
      if ((cVar3 == '0') &&
         (*pvVar13[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start == '1')) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_188,pvVar13);
        break;
      }
      pvVar19 = pvVar13 + 2;
      pvVar13 = pvVar13 + 4;
    } while (&(pvVar19->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage !=
             (pointer *)*(undefined1 **)(certData._0_8_ + 0x10));
  }
  if ((undefined1  [8])
      certMetaData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != auStack_188) {
    certData.value = 0;
    sign.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    sign.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    sigret = (uchar *)operator_new(0x400);
    certData.value = (uint64_t)sigret;
    sign.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = sigret;
    sign.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = sigret + 0x400;
    memset(sigret,0,0x400);
    pvVar13 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
              ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage + 4);
    sign.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = sigret + 0x400;
    RSA_sign(0x40,local_504 + 0x1c,0x14,sigret,(uint *)pvVar13,rsa);
    RSA_free(rsa);
    BIO_free_all(bp);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&certData.value,
               (ulong)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage._4_4_);
    stack0xfffffffffffffaf3 = 0x7010df78648862a;
    __l._M_len = 9;
    __l._M_array = manifestSha + 0x13;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_498,__l,&local_35);
    asn1::mkBIN((vec8 *)((long)&certSF.field_2 + 8),'\x06',&local_498);
    asn1::mkINT(&local_450,1);
    local_504[0x12] = '+';
    local_504[0x13] = '\x0e';
    local_504[0x14] = '\x03';
    local_504[0x15] = '\x02';
    local_504[0x16] = 0x1a;
    __l_00._M_len = 5;
    __l_00._M_array = local_504 + 0x12;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_3f0,__l_00,&local_34);
    asn1::mkBIN(&local_408,'\x06',&local_3f0);
    asn1::mkNIL();
    pvVar19 = &local_3d8;
    asn1::
    mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (&local_420,(asn1 *)0x30,(uint8_t)&local_408,pvVar19,pvVar13);
    asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (&local_438,(asn1 *)0x31,(uint8_t)&local_420,pvVar19);
    local_504[0] = '*';
    local_504[1] = 0x86;
    local_504[2] = 'H';
    local_504[3] = 0x86;
    local_504[4] = 0xf7;
    local_504[5] = '\r';
    local_504[6] = '\x01';
    local_504[7] = '\a';
    local_504[8] = 1;
    __a = &local_33;
    __l_01._M_len = 9;
    __l_01._M_array = local_504;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_390,__l_01,__a);
    asn1::mkBIN(&local_3a8,'\x06',&local_390);
    asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (&local_3c0,(asn1 *)0x30,(uint8_t)&local_3a8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a);
    asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (&local_378,(asn1 *)0xa0,(char)&pemKey + '\x18',
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a);
    asn1::mkINT(&local_348,1);
    asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (&local_318,(asn1 *)0x30,(uint8_t)auStack_188,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a);
    asn1::mkINT(&local_300,(ulong)uVar16);
    pvVar2 = local_40;
    asn1::
    mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (&local_330,(asn1 *)0x30,(uint8_t)&local_318,&local_300,pvVar13);
    local_504[0x17] = '+';
    local_504[0x18] = '\x0e';
    local_504[0x19] = '\x03';
    local_504[0x1a] = '\x02';
    local_504[0x1b] = 0x1a;
    __l_02._M_len = 5;
    __l_02._M_array = local_504 + 0x17;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_2b8,__l_02,&local_32);
    asn1::mkBIN(&local_2d0,'\x06',&local_2b8);
    asn1::mkNIL();
    asn1::
    mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (&local_2e8,(asn1 *)0x30,(uint8_t)&local_2d0,&local_2a0,pvVar13);
    local_504[9] = '*';
    local_504[10] = 0x86;
    local_504[0xb] = 'H';
    local_504[0xc] = 0x86;
    local_504[0xd] = 0xf7;
    local_504[0xe] = '\r';
    local_504[0xf] = '\x01';
    local_504[0x10] = '\x01';
    local_504[0x11] = 1;
    __l_03._M_len = 9;
    __l_03._M_array = local_504 + 9;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_258,__l_03,&local_31);
    asn1::mkBIN(&local_270,'\x06',&local_258);
    asn1::mkNIL();
    asn1::
    mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (&local_288,(asn1 *)0x30,(uint8_t)&local_270,&local_240,pvVar13);
    pvVar19 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x124f0c;
    asn1::mkBIN(&local_4b0,'\x04',(vec8 *)&certData.value);
    pvVar13 = &local_330;
    asn1::
    mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (&local_360,(asn1 *)0x30,(uint8_t)&local_348,pvVar13,&local_2e8,&local_288,&local_4b0,
               pvVar19);
    v_4 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x124f5d;
    asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (&local_4c8,(asn1 *)0x31,(uint8_t)&local_360,pvVar13);
    pvVar13 = &local_438;
    pvVar19 = &local_3c0;
    asn1::
    mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (&local_468,(asn1 *)0x30,(uint8_t)&local_450,pvVar13,pvVar19,&local_378,&local_4c8,v_4
              );
    asn1::mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (&local_480,(asn1 *)0xa0,(uint8_t)&local_468,pvVar13);
    asn1::
    mkSEQ<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_168,(asn1 *)0x30,
               (char)&certSF + '\x18',&local_480,pvVar19);
    if (local_480.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_480.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_480.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_480.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_468.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_468.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_468.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_468.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_4c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_4c8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_4c8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_360.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_360.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_360.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_360.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_4b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_4b0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_4b0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_288.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_288.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_288.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_240.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_240.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_240.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_240.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_270.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_270.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_270.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_270.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_258.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_258.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_258.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_2e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_2e8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2e8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_2a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_2a0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_2d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_2d0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2d0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_2b8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2b8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_330.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_330.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_330.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_330.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_300.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_300.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_300.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_300.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_318.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_318.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_318.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_318.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_348.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_348.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_378.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_378.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_3c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_3c0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3c0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_3a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_390.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_390.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_390.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_390.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_438.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_438.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_438.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_420.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_420.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_420.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_420.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_3d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_3d8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3d8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_408.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_408.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_408.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_3f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_3f0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3f0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_450.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_450.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_450.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_450.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (certSF.field_2._8_8_ != 0) {
      operator_delete((void *)certSF.field_2._8_8_,
                      local_50._M_allocated_capacity - certSF.field_2._8_8_);
    }
    if (local_498.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_498.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_498.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_498.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    uVar6 = crc32_fast((void *)local_168,
                       (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start - (long)local_168,0);
    certSF.field_2._8_8_ = &local_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&certSF.field_2 + 8),"META-INF/CERT.RSA","");
    ZipArchive::addFile((ZipArchive *)ctx,(string *)((long)&certSF.field_2 + 8),true,
                        (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_start - (long)local_168,
                        (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_start - (long)local_168,0,uVar6,0)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)certSF.field_2._8_8_ != &local_50) {
      operator_delete((void *)certSF.field_2._8_8_,local_50._M_allocated_capacity + 1);
    }
    fwrite((void *)local_168,1,
           (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start - (long)local_168,*(FILE **)(ctx + 0x28));
    if (local_168 != (undefined1  [8])0x0) {
      operator_delete((void *)local_168,
                      (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)local_168);
    }
    if (certData.value != 0) {
      operator_delete((void *)certData.value,
                      (long)sign.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - certData.value);
    }
    if (auStack_188 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_188,
                      (long)certMetaData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_188);
    }
    if ((size_type *)
        certData.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != &certData.text._M_string_length) {
      operator_delete(certData.data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,certData.text._M_string_length + 1);
    }
    if (certData.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(certData.children.super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)certData.data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)certData.children.
                            super__Vector_base<asn1::DER,_std::allocator<asn1::DER>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    }
    std::vector<asn1::DER,_std::allocator<asn1::DER>_>::~vector
              ((vector<asn1::DER,_std::allocator<asn1::DER>_> *)&certData);
    if (pemKey.field_2._8_8_ != 0) {
      operator_delete((void *)pemKey.field_2._8_8_,
                      (long)certificate.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - pemKey.field_2._8_8_);
    }
    if ((size_type *)
        sign.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != &pemKey._M_string_length) {
      operator_delete(sign.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage,pemKey._M_string_length + 1);
    }
    if (pvVar2 != (vector<asn1::DER,_std::allocator<asn1::DER>_> *)0x0) {
      operator_delete(pvVar2,(long)pDVar15 - (long)pvVar2);
    }
    if (local_80 != &certSF._M_string_length) {
      operator_delete(local_80,certSF._M_string_length + 1);
    }
    if (local_1c8 != &sigHead._M_string_length) {
      operator_delete(local_1c8,sigHead._M_string_length + 1);
    }
    if (head.field_2._8_8_ != 0) {
      operator_delete((void *)head.field_2._8_8_,
                      (long)digestCopy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish - head.field_2._8_8_);
    }
    if ((size_type *)
        digestCopy.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != &manifestMF._M_string_length) {
      operator_delete(digestCopy.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,manifestMF._M_string_length + 1);
    }
    psVar10 = &head._M_string_length;
    if (local_228 != (undefined1  [8])psVar10) {
      operator_delete((void *)local_228,head._M_string_length + 1);
      psVar10 = extraout_RAX;
    }
    return (int)psVar10;
  }
  puVar8 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar8 = &PTR__exception_0014bb08;
  puVar8[1] = "Could not extract certificate from keystore";
  __cxa_throw(puVar8,&sign_exception::typeinfo,std::exception::~exception);
}

Assistant:

void sign(ZipArchive& zipArchive, KeyStore& keyStore, const string& digestFile)
{
    SHA_CTX context;
    string head = "Manifest-Version: 1.0\015\012Created-By: 1.0 "
                  "(Fastzip)\015\012\015\012";

    string manifestMF = head + digestFile;
    uint8_t manifestSha[SHA_LEN];
    SHA1_Init(&context);
    SHA1_Update(&context, manifestMF.c_str(), manifestMF.length());
    SHA1_Final(manifestSha, &context);

    uint32_t checksum = crc32_fast(manifestMF.c_str(), manifestMF.length());
    zipArchive.addFile("META-INF/MANIFEST.MF", true, manifestMF.length(),
                       manifestMF.length(), 0, checksum);
    zipArchive.write((uint8_t*)manifestMF.c_str(), manifestMF.length());

    unsigned char sha[SHA_LEN];

    vector<char> digestCopy(digestFile.length() + 1);
    strcpy(&digestCopy[0], digestFile.c_str());

    char* digestPtr = &digestCopy[0];
    while (true) {
        char* ptr = digestPtr;

        while (*ptr) {
            if (ptr[0] == 0x0d && ptr[1] == 0xa && ptr[2] == 0x0d &&
                ptr[3] == 0x0a)
                break;
            ptr++;
        }

        if (!*ptr)
            break;

        ptr += 4;

        SHA1_Init(&context);
        SHA1_Update(&context, digestPtr, ptr - digestPtr);
        SHA1_Final(sha, &context);
        memcpy(ptr - 32, base64_encode(sha, SHA_LEN).c_str(), 28);

        digestPtr = ptr;
    }
    const string sigHead = "Signature-Version: 1.0\015\012Created-By: 1.0 "
                           "(Fastzip)\015\012SHA1-Digest-Manifest: ";

    string certSF = sigHead + base64_encode(manifestSha, SHA_LEN) +
                    "\015\012\015\012" + string(&digestCopy[0]);

    checksum = crc32_fast(certSF.c_str(), certSF.length());
    zipArchive.addFile("META-INF/CERT.SF", true, certSF.length(),
                       certSF.length(), 0, checksum);
    zipArchive.write((uint8_t*)certSF.c_str(), certSF.length());

    unsigned char digest[SHA_LEN];
    memset(digest, 0, SHA_LEN);

    SHA1_Init(&context);
    SHA1_Update(&context, certSF.c_str(), certSF.size());
    SHA1_Final(digest, &context);

    vector<uint8_t> key;
    try {
        key = keyStore.getKey();
    } catch (key_exception& ke) {
        throw sign_exception(ke);
    }

    string pemKey = toPem(key);
    BIO* bio = BIO_new_mem_buf((void*)pemKey.c_str(), -1);
    RSA* rsa = PEM_read_bio_RSAPrivateKey(bio, NULL, NULL, NULL);
    if (rsa == nullptr)
        throw sign_exception("Could not read valid RSA key");

    vector<uint8_t> certificate = keyStore.getCert();

    // Extract the meta data
    DER certData = readDER(certificate);

    vector<uint8_t> certMetaData;
    uint32_t timeStamp = 0;
    for (auto& cd : certData[0]) {
        if (cd.tag == 0x02 && timeStamp == 0) {
            timeStamp = cd.value;
        }
        if (cd.tag == 0x30 && cd[0].tag == 0x31) {
            certMetaData = cd.data;
            break;
        }
    }

    if (certMetaData.size() == 0)
        throw sign_exception("Could not extract certificate from keystore");

    vector<uint8_t> sign(1024);
    unsigned int signLen;

    RSA_sign(NID_sha1, digest, SHA_LEN, &sign[0], &signLen, rsa);

    RSA_free(rsa);

    BIO_free_all(bio);

    sign.resize(signLen);
    // clang-format off
    auto data =
        mkSEQ(0x30,
            // PKCS7 SIGNED
            mkBIN(0x6, { 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x07, 0x02 }),
            mkSEQ(0xA0,
                mkSEQ(0x30,
                    mkINT(1),
                    mkSEQ(0x31,
                        mkSEQ(0x30,
                            // SHA1
                            mkBIN(0x6, { 0x2b, 0x0e, 0x03, 0x02, 0x1a }),
                            mkNIL()
                            )
                        ),
                    mkSEQ(0x30,
                        // PKC7
                        mkBIN(0x6, { 0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x07, 0x01 })
                        ),
                    mkSEQ(0xA0, certificate),
                    mkSEQ(0x31,
                        mkSEQ(0x30,
                            mkINT(1),
                            mkSEQ(0x30,
                                mkSEQ(0x30, certMetaData),
                                mkINT(timeStamp)
                                ),
                            mkSEQ(0x30,
                                // SHA1
                                mkBIN(0x6, { 0x2b, 0xe, 0x3, 0x2, 0x1a}),
                                mkNIL()
                                ),
                            mkSEQ(0x30,
                                // RSA ENCRYPTION,
                                mkBIN(0x6, {0x2a, 0x86, 0x48, 0x86, 0xf7, 0x0d, 0x01, 0x01, 0x01 }),
                                mkNIL()
                                ),
                            mkBIN(0x04, sign)
                            )
                        )
                    )
                )
            );
	// clang-format off
    checksum = crc32_fast(&data[0], data.size());
    zipArchive.addFile("META-INF/CERT.RSA", true, data.size(), data.size(), 0, checksum);
    zipArchive.write(&data[0], data.size());
}